

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Ref<embree::Image> __thiscall embree::loadImage(embree *this,FileName *fileName,bool cache)

{
  Image *pIVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  undefined3 in_register_00000011;
  Image *local_48;
  key_type local_40;
  
  if (CONCAT31(in_register_00000011,cache) == 0) {
    loadImageFromDisk(this,fileName);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)fileName);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
                    *)image_cache_abi_cxx11_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (iVar2._M_node == (_Base_ptr)(image_cache_abi_cxx11_ + 8)) {
      loadImageFromDisk((embree *)&local_48,fileName);
      std::__cxx11::string::string((string *)&local_40,(string *)fileName);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
                             *)image_cache_abi_cxx11_,&local_40);
      if (pmVar3->ptr != (Image *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar3->ptr = local_48;
      local_48 = (Image *)0x0;
      std::__cxx11::string::~string((string *)&local_40);
      if (local_48 != (Image *)0x0) {
        (*(local_48->super_RefCount)._vptr_RefCount[3])();
      }
    }
    std::__cxx11::string::string((string *)&local_40,(string *)fileName);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::Image>_>_>_>
                           *)image_cache_abi_cxx11_,&local_40);
    pIVar1 = pmVar3->ptr;
    *(Image **)this = pIVar1;
    if (pIVar1 != (Image *)0x0) {
      (*(pIVar1->super_RefCount)._vptr_RefCount[2])();
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (Ref<embree::Image>)(Image *)this;
}

Assistant:

Ref<Image> loadImage(const FileName& fileName, bool cache)
  {
    if (!cache)
      return loadImageFromDisk(fileName);

    if (image_cache.find(fileName) == image_cache.end())
      image_cache[fileName] = loadImageFromDisk(fileName);

    return image_cache[fileName];
  }